

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_path_update(lyd_node *node,void *value,LYD_ANYDATA_VALUETYPE value_type,int dflt)

{
  LYS_NODE LVar1;
  LYD_ANYDATA_VALUETYPE LVar2;
  int iVar3;
  hash_table *phVar4;
  char *format;
  LY_ERR no;
  ly_ctx *ctx;
  
  ctx = node->schema->module->ctx;
  LVar1 = node->schema->nodetype;
  if ((LVar1 != LYS_ANYDATA) && (LVar1 != LYS_ANYXML)) {
    if (LVar1 != LYS_LEAF) {
      return (lyd_node *)0x0;
    }
    if (value_type < LYD_ANYDATA_JSON) {
      iVar3 = lyd_change_leaf((lyd_node_leaf_list *)node,(char *)value);
      if (iVar3 == 0) {
        if (dflt == 0) {
          return node;
        }
      }
      else if (dflt == 0) {
        return (lyd_node *)0x0;
      }
      node->field_0x9 = node->field_0x9 | 1;
      return node;
    }
    format = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
LAB_001666b7:
    ly_log(ctx,LY_LLERR,no,format,"lyd_new_path_update");
    return (lyd_node *)0x0;
  }
  LVar2 = *(LYD_ANYDATA_VALUETYPE *)&node->field_0x34;
  if ((LVar2 | value_type) < LYD_ANYDATA_JSON) {
    iVar3 = ly_strequal_((char *)node->ht,(char *)value);
    if (iVar3 != 0) {
      return (lyd_node *)0x0;
    }
    LVar2 = *(LYD_ANYDATA_VALUETYPE *)&node->field_0x34;
  }
  else if ((LVar2 == value_type) && (LVar2 = value_type, node->ht == (hash_table *)value)) {
    return (lyd_node *)0x0;
  }
  switch(LVar2) {
  case LYD_ANYDATA_CONSTSTRING:
  case LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML:
    lydict_remove(ctx,(char *)node->ht);
    break;
  case LYD_ANYDATA_STRING:
  case LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_SXMLD:
switchD_00166708_caseD_1:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x718,
                  "struct lyd_node *lyd_new_path_update(struct lyd_node *, void *, LYD_ANYDATA_VALUETYPE, int)"
                 );
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_STRING:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXMLD:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
    break;
  case LYD_ANYDATA_XML:
    lyxml_free_withsiblings(ctx,(lyxml_elem *)node->ht);
    break;
  case LYD_ANYDATA_DATATREE:
    lyd_free_withsiblings((lyd_node *)node->ht);
    break;
  default:
    if (LVar2 == LYD_ANYDATA_LYB) {
      free(node->ht);
    }
    else if (LVar2 == LYD_ANYDATA_LYBD) goto switchD_00166708_caseD_1;
  }
  switch(value_type) {
  case LYD_ANYDATA_CONSTSTRING:
  case LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML:
    phVar4 = (hash_table *)lydict_insert(ctx,(char *)value,0);
    break;
  case LYD_ANYDATA_STRING:
  case LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_SXMLD:
    phVar4 = (hash_table *)lydict_insert_zc(ctx,(char *)value);
    break;
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_STRING:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXMLD:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSON:
  case LYD_ANYDATA_XML|LYD_ANYDATA_SXML|LYD_ANYDATA_JSOND:
    goto switchD_001667a0_caseD_6;
  default:
    if (value_type == LYD_ANYDATA_LYB) {
      iVar3 = lyd_lyb_data_length((char *)value);
      if (iVar3 == -1) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
        return (lyd_node *)0x0;
      }
      phVar4 = (hash_table *)malloc((long)iVar3);
      node->ht = phVar4;
      if (phVar4 != (hash_table *)0x0) {
        memcpy(phVar4,value,(long)iVar3);
        return node;
      }
      format = "Memory allocation failed (%s()).";
      no = LY_EMEM;
      goto LAB_001666b7;
    }
    if (value_type != LYD_ANYDATA_LYBD) {
      return node;
    }
  case LYD_ANYDATA_XML:
  case LYD_ANYDATA_DATATREE:
    node->ht = (hash_table *)value;
    return node;
  }
  node->ht = phVar4;
switchD_001667a0_caseD_6:
  return node;
}

Assistant:

static struct lyd_node *
lyd_new_path_update(struct lyd_node *node, void *value, LYD_ANYDATA_VALUETYPE value_type, int dflt)
{
    struct ly_ctx *ctx = node->schema->module->ctx;
    struct lyd_node_anydata *any;
    int len;

    switch (node->schema->nodetype) {
    case LYS_LEAF:
        if (value_type > LYD_ANYDATA_STRING) {
            LOGARG;
            return NULL;
        }

        if (lyd_change_leaf((struct lyd_node_leaf_list *)node, value) == 0) {
            /* there was an actual change */
            if (dflt) {
                node->dflt = 1;
            }
            return node;
        }

        if (dflt) {
            /* maybe the value is the same, but the node is default now */
            node->dflt = 1;
            return node;
        }

        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* the nodes are the same if:
         * 1) the value types are strings (LYD_ANYDATA_STRING and LYD_ANYDATA_CONSTSTRING equals)
         *    and the strings equals
         * 2) the value types are the same, but not strings and the pointers (not the content) are the
         *    same
         */
        any = (struct lyd_node_anydata *)node;
        if (any->value_type <= LYD_ANYDATA_STRING && value_type <= LYD_ANYDATA_STRING) {
            if (ly_strequal(any->value.str, (char *)value, 0)) {
                /* values are the same */
                return NULL;
            }
        } else if (any->value_type == value_type) {
            /* compare pointers */
            if ((void *)any->value.tree == value) {
                /* values are the same */
                return NULL;
            }
        }

        /* values are not the same - 1) remove the old one ... */
        switch (any->value_type) {
        case LYD_ANYDATA_CONSTSTRING:
        case LYD_ANYDATA_SXML:
        case LYD_ANYDATA_JSON:
            lydict_remove(ctx, any->value.str);
            break;
        case LYD_ANYDATA_DATATREE:
            lyd_free_withsiblings(any->value.tree);
            break;
        case LYD_ANYDATA_XML:
            lyxml_free_withsiblings(ctx, any->value.xml);
            break;
        case LYD_ANYDATA_LYB:
            free(any->value.mem);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
        case LYD_ANYDATA_LYBD:
            /* dynamic strings are used only as input parameters */
            assert(0);
            break;
        }
        /* ... and 2) store the new one */
        switch (value_type) {
        case LYD_ANYDATA_CONSTSTRING:
        case LYD_ANYDATA_SXML:
        case LYD_ANYDATA_JSON:
            any->value.str = lydict_insert(ctx, (const char *)value, 0);
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_SXMLD:
        case LYD_ANYDATA_JSOND:
            any->value.str = lydict_insert_zc(ctx, (char *)value);
            value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
            break;
        case LYD_ANYDATA_DATATREE:
            any->value.tree = value;
            break;
        case LYD_ANYDATA_XML:
            any->value.xml = value;
            break;
        case LYD_ANYDATA_LYB:
            len = lyd_lyb_data_length(value);
            if (len == -1) {
                LOGERR(ctx, LY_EINVAL, "Invalid LYB data.");
                return NULL;
            }
            any->value.mem = malloc(len);
            LY_CHECK_ERR_RETURN(!any->value.mem, LOGMEM(ctx), NULL);
            memcpy(any->value.mem, value, len);
            break;
        case LYD_ANYDATA_LYBD:
            any->value.mem = value;
            value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
            break;
        }
        return node;
    default:
        /* nothing needed - containers, lists and leaf-lists do not have value or it cannot be changed */
        break;
    }

    /* not updated */
    return NULL;
}